

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32Ramp.cpp
# Opt level: O2

void __thiscall MT32Emu::LA32Ramp::reset(LA32Ramp *this)

{
  this->interruptCountdown = 0;
  this->interruptRaised = false;
  this->current = 0;
  this->largeTarget = 0;
  *(undefined8 *)((long)&this->largeTarget + 1) = 0;
  return;
}

Assistant:

void LA32Ramp::reset() {
	current = 0;
	largeTarget = 0;
	largeIncrement = 0;
	descending = false;
	interruptCountdown = 0;
	interruptRaised = false;
}